

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenAtomicRMW(BinaryenModuleRef module,BinaryenOp op,BinaryenIndex bytes,BinaryenIndex offset,
                 BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
                 char *memoryName)

{
  AtomicRMW *pAVar1;
  Address offset_00;
  Name memory;
  Builder local_38;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  local_38.wasm = module;
  memory = getMemoryName(module,memoryName);
  pAVar1 = wasm::Builder::makeAtomicRMW(&local_38,op,bytes,offset_00,ptr,value,(Type)type,memory);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicRMW(BinaryenModuleRef module,
                                        BinaryenOp op,
                                        BinaryenIndex bytes,
                                        BinaryenIndex offset,
                                        BinaryenExpressionRef ptr,
                                        BinaryenExpressionRef value,
                                        BinaryenType type,
                                        const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicRMW(AtomicRMWOp(op),
                     bytes,
                     offset,
                     (Expression*)ptr,
                     (Expression*)value,
                     Type(type),
                     getMemoryName(module, memoryName)));
}